

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O1

size_type llvm::StrInStrNoCase(StringRef s1,StringRef s2)

{
  int iVar1;
  ulong uVar2;
  size_t N;
  ulong uVar3;
  ulong uVar4;
  size_t M;
  ulong uVar5;
  StringRef local_40;
  
  uVar5 = s1.Length;
  uVar3 = s2.Length;
  if ((uVar3 <= uVar5) && (uVar5 + 1 != uVar3)) {
    uVar4 = 0;
    do {
      uVar2 = uVar5;
      if (uVar4 < uVar5) {
        uVar2 = uVar4;
      }
      local_40.Data = s1.Data + uVar2;
      if ((uVar3 <= uVar5 - uVar2) &&
         (local_40.Length = uVar3, iVar1 = StringRef::compare_lower(&local_40,s2), iVar1 == 0)) {
        return uVar4;
      }
      uVar4 = uVar4 + 1;
    } while ((uVar5 + 1) - uVar3 != uVar4);
  }
  return 0xffffffffffffffff;
}

Assistant:

StringRef::size_type llvm::StrInStrNoCase(StringRef s1, StringRef s2) {
  size_t N = s2.size(), M = s1.size();
  if (N > M)
    return StringRef::npos;
  for (size_t i = 0, e = M - N + 1; i != e; ++i)
    if (s1.substr(i, N).equals_lower(s2))
      return i;
  return StringRef::npos;
}